

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O2

int xmlModuleClose(xmlModulePtr module)

{
  int iVar1;
  
  if (module != (xmlModulePtr)0x0) {
    iVar1 = dlclose(module->handle);
    if (iVar1 == 0) {
      (*xmlFree)(module->name);
      (*xmlFree)(module);
      iVar1 = 0;
    }
    else {
      iVar1 = -2;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlModuleClose(xmlModulePtr module)
{
    int rc;

    if (NULL == module)
        return -1;

    rc = xmlModulePlatformClose(module->handle);

    if (rc != 0)
        return -2;

    rc = xmlModuleFree(module);
    return (rc);
}